

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

int Abc_CexCountOnes(Abc_Cex_t *p)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = ((p->nBits >> 5) + 1) - (uint)((p->nBits & 0x1fU) == 0);
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  iVar1 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = (&p[1].iPo)[uVar4] - ((uint)(&p[1].iPo)[uVar4] >> 1 & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    iVar1 = iVar1 + (((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18);
  }
  return iVar1;
}

Assistant:

int Abc_CexCountOnes( Abc_Cex_t * p )
{
    int nWords = Abc_BitWordNum( p->nBits );
    int i, Count = 0;
    for ( i = 0; i < nWords; i++ )
        Count += Abc_CexOnes32( p->pData[i] );
    return Count;
}